

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.cc
# Opt level: O2

LinearObjBuilder __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::AddObj
          (BasicProblem<mp::BasicProblemParams<int>_> *this,Type type,NumericExpr expr,
          int num_linear_terms)

{
  small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *this_00;
  LinearExprBuilder local_a0;
  small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> local_98;
  
  std::vector<bool,_std::allocator<bool>_>::push_back(&this->is_obj_max_,type != MIN);
  local_98.m_data.super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr =
       (ptr)&local_98.m_data.m_storage;
  local_98.m_data.super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_capacity = 6
  ;
  local_98.m_data.super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_size = 0;
  std::vector<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>::emplace_back<mp::LinearExpr>
            (&this->linear_objs_,(LinearExpr *)&local_98);
  gch::detail::small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::~small_vector_base
            (&local_98);
  this_00 = (small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)
            ((this->linear_objs_).
             super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
             super__Vector_impl_data._M_finish + -1);
  gch::detail::small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::request_capacity
            (this_00,(long)num_linear_terms);
  if (expr.super_ExprBase.impl_ != (Impl *)0x0) {
    SetNonlinearObjExpr(this,(int)(((long)(this->linear_objs_).
                                          super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->linear_objs_).
                                         super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>
                                         ._M_impl.super__Vector_impl_data._M_start) / 0x78) + -1,
                        expr);
  }
  LinearExprBuilder::LinearExprBuilder(&local_a0,(LinearExpr *)this_00);
  return (LinearObjBuilder)local_a0.expr_;
}

Assistant:

typename BasicProblem<Alloc>::LinearObjBuilder BasicProblem<Alloc>::AddObj(
    obj::Type type, NumericExpr expr, int num_linear_terms) {
  MP_ASSERT(linear_objs_.size() < MP_MAX_PROBLEM_ITEMS, "too many objectives");
  is_obj_max_.push_back(type != obj::MIN);
  linear_objs_.push_back(LinearExpr());
  LinearExpr &linear_expr = linear_objs_.back();
  linear_expr.Reserve(num_linear_terms);
  if (expr)
    SetNonlinearObjExpr(static_cast<int>(linear_objs_.size() - 1), expr);
  return LinearObjBuilder(&linear_expr);
}